

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::TeamCityReporter::testGroupEnded(TeamCityReporter *this,TestGroupStats *testGroupStats)

{
  ostream *poVar1;
  string local_30;
  
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  (this->super_StreamingReporterBase).currentGroupInfo.used = false;
  poVar1 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"##teamcity[testSuiteFinished name=\'",0x23);
  anon_unknown_23::escape
            (&local_30,(anon_unknown_23 *)(testGroupStats->groupInfo).name._M_dataplus._M_p,
             (string *)(testGroupStats->groupInfo).name._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TeamCityReporter::testGroupEnded(TestGroupStats const &testGroupStats) {
        StreamingReporterBase::testGroupEnded(testGroupStats);
        stream << "##teamcity[testSuiteFinished name='"
            << escape(testGroupStats.groupInfo.name) << "']\n";
    }